

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O0

void __thiscall NaPNDelay::add_delay(NaPNDelay *this,uint iShift)

{
  undefined4 *puVar1;
  int in_ESI;
  long in_RDI;
  uint i;
  uint local_10;
  
  NaPetriNode::check_tunable((NaPetriNode *)0x14bd2b);
  if ((*(long *)(in_RDI + 0x1c0) != 0) && (*(int *)(in_RDI + 0x1c8) != 0)) {
    for (local_10 = 0; local_10 < *(uint *)(in_RDI + 0x1c8); local_10 = local_10 + 1) {
      *(int *)(*(long *)(in_RDI + 0x1c0) + (ulong)local_10 * 4) =
           in_ESI + *(int *)(*(long *)(in_RDI + 0x1c0) + (ulong)local_10 * 4);
    }
    *(int *)(in_RDI + 400) = in_ESI + *(int *)(in_RDI + 400);
    *(int *)(in_RDI + 0x194) = in_ESI + *(int *)(in_RDI + 0x194);
    return;
  }
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0;
  __cxa_throw(puVar1,&NaException::typeinfo,0);
}

Assistant:

void
NaPNDelay::add_delay (unsigned iShift)
{
    check_tunable();

    if(NULL == piOutMap || 0 == nOutDim)
      throw(na_null_pointer);

    unsigned	i;
    for(i = 0; i < nOutDim; ++i)
      piOutMap[i] += iShift;
    nMaxLag += iShift;
    nMinLag += iShift;
}